

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkStructureType VVar1;
  bool bVar2;
  VkSamplerYcbcrConversionCreateInfo *create_info;
  VkShaderModuleCreateInfo *pVVar3;
  iterator iVar4;
  VkPipelineTessellationDomainOriginStateCreateInfo *ci;
  void **ppvVar5;
  long *in_FS_OFFSET;
  VkShaderModuleCreateInfo *new_module;
  VkGraphicsPipelineLibraryFlagsEXT local_4c;
  _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  void **local_40;
  void *local_38;
  
  ppvVar5 = &local_38;
  local_38 = (void *)0x0;
  local_48 = &(this->ycbcr_conversions)._M_h;
  local_4c = state_flags;
  local_40 = out_pnext;
  do {
    create_info = (VkSamplerYcbcrConversionCreateInfo *)pnext_chain_skip_ignored_entries(pNext);
    if (create_info == (VkSamplerYcbcrConversionCreateInfo *)0x0) {
      *local_40 = local_38;
LAB_0011893d:
      return create_info == (VkSamplerYcbcrConversionCreateInfo *)0x0;
    }
    VVar1 = create_info->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
      new_module = (VkShaderModuleCreateInfo *)0x0;
      bVar2 = copy_shader_module(this,(VkShaderModuleCreateInfo *)create_info,alloc,true,&new_module
                                );
LAB_001188f0:
      pVVar3 = new_module;
      if (bVar2 == false) goto LAB_0011893d;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkPipelineRasterizationStateStreamCreateInfoEXT>
                         (this,(VkPipelineRasterizationStateStreamCreateInfoEXT *)create_info,alloc)
      ;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkPipelineRenderingCreateInfoKHR *)create_info,alloc,local_4c
                                );
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkRenderPassMultiviewCreateInfo *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkPipelineRobustnessCreateInfo>
                         (this,(VkPipelineRobustnessCreateInfo *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkPipelineDiscardRectangleStateCreateInfoEXT *)create_info,
                                 alloc,dynamic_state_info);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkPipelineRasterizationConservativeStateCreateInfoEXT>
                         (this,(VkPipelineRasterizationConservativeStateCreateInfoEXT *)create_info,
                          alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkPipelineRasterizationDepthClipStateCreateInfoEXT>
                         (this,(VkPipelineRasterizationDepthClipStateCreateInfoEXT *)create_info,
                          alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkRenderPassInputAttachmentAspectCreateInfo *)create_info,
                                 alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkPipelineViewportDepthClampControlCreateInfoEXT *)
                                      create_info,alloc,dynamic_state_info);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkSamplerReductionModeCreateInfo>
                         (this,(VkSamplerReductionModeCreateInfo *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkSampleLocationsInfoEXT *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct(this,(VkPipelineSampleLocationsStateCreateInfoEXT *)create_info,
                                 alloc,dynamic_state_info);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkPipelineColorBlendAdvancedStateCreateInfoEXT>
                         (this,(VkPipelineColorBlendAdvancedStateCreateInfoEXT *)create_info,alloc);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
      pVVar3 = (VkShaderModuleCreateInfo *)
               copy_pnext_struct_simple<VkSamplerYcbcrConversionCreateInfo>(this,create_info,alloc);
    }
    else {
      if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO) {
        iVar4 = std::
                _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_48,(key_type *)&create_info->format);
        if (iVar4.
            super__Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
            ._M_cur != (__node_type *)0x0) {
          bVar2 = copy_ycbcr_conversion
                            (this,*(VkSamplerYcbcrConversionCreateInfo **)
                                   ((long)iVar4.
                                          super__Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                                          ._M_cur + 0x10),alloc,
                             (VkSamplerYcbcrConversionCreateInfo **)&new_module);
          goto LAB_001188f0;
        }
        goto LAB_0011893d;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
        pVVar3 = (VkShaderModuleCreateInfo *)
                 copy_pnext_struct(this,(VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)
                                        create_info,alloc);
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
        pVVar3 = (VkShaderModuleCreateInfo *)
                 copy_pnext_struct(this,(VkPipelineVertexInputDivisorStateCreateInfoKHR *)
                                        create_info,alloc);
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
        pVVar3 = (VkShaderModuleCreateInfo *)
                 copy_pnext_struct(this,(VkSubpassDescriptionDepthStencilResolve *)create_info,alloc
                                  );
LAB_001188c4:
        if (pVVar3 == (VkShaderModuleCreateInfo *)0x0) goto LAB_0011893d;
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
        pVVar3 = (VkShaderModuleCreateInfo *)
                 copy_pnext_struct_simple<VkRenderPassFragmentDensityMapCreateInfoEXT>
                           (this,(VkRenderPassFragmentDensityMapCreateInfoEXT *)create_info,alloc);
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO)
      {
        pVVar3 = (VkShaderModuleCreateInfo *)
                 copy_pnext_struct_simple<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                           (this,(VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)create_info,
                            alloc);
      }
      else {
        if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkFragmentShadingRateAttachmentInfoKHR *)create_info,
                                     alloc);
          goto LAB_001188c4;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkPipelineFragmentShadingRateStateCreateInfoKHR>
                             (this,(VkPipelineFragmentShadingRateStateCreateInfoKHR *)create_info,
                              alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkRenderingAttachmentLocationInfoKHR *)create_info,alloc)
          ;
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkRenderingInputAttachmentIndexInfoKHR *)create_info,
                                     alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkAttachmentReferenceStencilLayout>
                             (this,(VkAttachmentReferenceStencilLayout *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkAttachmentDescriptionStencilLayout>
                             (this,(VkAttachmentDescriptionStencilLayout *)create_info,alloc);
        }
        else if (VVar1 == 
                 VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkPipelineRasterizationProvokingVertexStateCreateInfoEXT>
                             (this,(VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *)
                                   create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkPipelineRasterizationLineStateCreateInfo>
                             (this,(VkPipelineRasterizationLineStateCreateInfo *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkDepthBiasRepresentationInfoEXT>
                             (this,(VkDepthBiasRepresentationInfoEXT *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkSamplerCustomBorderColorCreateInfoEXT>
                             (this,(VkSamplerCustomBorderColorCreateInfoEXT *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkPipelineLibraryCreateInfoKHR *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkMemoryBarrier2>
                             (this,(VkMemoryBarrier2 *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkGraphicsPipelineLibraryCreateInfoEXT>
                             (this,(VkGraphicsPipelineLibraryCreateInfoEXT *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkMutableDescriptorTypeCreateInfoEXT *)create_info,alloc)
          ;
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkPipelineViewportDepthClipControlCreateInfoEXT>
                             (this,(VkPipelineViewportDepthClipControlCreateInfoEXT *)create_info,
                              alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkMultisampledRenderToSingleSampledInfoEXT>
                             (this,(VkMultisampledRenderToSingleSampledInfoEXT *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkPipelineColorWriteCreateInfoEXT *)create_info,alloc,
                                     dynamic_state_info);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT)
        {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkSamplerBorderColorComponentMappingCreateInfoEXT>
                             (this,(VkSamplerBorderColorComponentMappingCreateInfoEXT *)create_info,
                              alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkRenderPassCreationControlEXT>
                             (this,(VkRenderPassCreationControlEXT *)create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
        {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct(this,(VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)
                                          create_info,alloc);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkPipelineCreateFlags2CreateInfo>
                             (this,(VkPipelineCreateFlags2CreateInfo *)create_info,alloc);
          pVVar3->flags = pVVar3->flags & 0x7ffffc3f;
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
            if ((*(int *)(*in_FS_OFFSET + -0x18) < 3) &&
               (bVar2 = Internal::log_thread_callback
                                  (LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n",(ulong)VVar1),
               !bVar2)) {
              fprintf(_stderr,"Fossilize ERROR: Cannot copy unknown pNext sType: %d.\n",
                      (ulong)create_info->sType);
            }
            goto LAB_0011893d;
          }
          pVVar3 = (VkShaderModuleCreateInfo *)
                   copy_pnext_struct_simple<VkPipelineTessellationDomainOriginStateCreateInfo>
                             (this,(VkPipelineTessellationDomainOriginStateCreateInfo *)create_info,
                              alloc);
        }
      }
    }
    *ppvVar5 = pVVar3;
    pNext = create_info->pNext;
    pVVar3->pNext = (void *)0x0;
    ppvVar5 = &pVVar3->pNext;
  } while( true );
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain(const void *pNext, ScratchAllocator &alloc, const void **out_pnext,
                                           const DynamicStateInfo *dynamic_state_info,
                                           VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
		{
			auto ci = static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			auto *ci = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);
			auto *resolve = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!resolve)
				return false;
			*ppNext = resolve;
			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			auto *ci = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);
			auto *rate = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!rate)
				return false;
			*ppNext = rate;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, state_flags));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			auto *ci = static_cast<const VkMemoryBarrier2KHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		{
			// Special case. Instead of serializing the YCbCr object link, serialize the original create info.
			// Reduces excessive churn for supporting an extremely niche object type.
			auto *ci = static_cast<const VkSamplerYcbcrConversionInfo *>(pNext);
			auto ycbcr = ycbcr_conversions.find(ci->conversion);
			if (ycbcr == ycbcr_conversions.end())
				return false;

			VkSamplerYcbcrConversionCreateInfo *new_create_info;
			if (!copy_ycbcr_conversion(ycbcr->second, alloc, &new_create_info))
				return false;

			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_create_info);
			break;
		}

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkShaderModuleCreateInfo *>(pNext);
			VkShaderModuleCreateInfo *new_module = nullptr;
			if (!copy_shader_module(ci, alloc, true, &new_module))
				return false;
			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_module);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext);
			auto *flags2 = static_cast<VkPipelineCreateFlags2CreateInfoKHR *>(copy_pnext_struct_simple(ci, alloc));
			flags2->flags = normalize_pipeline_creation_flags(flags2->flags);
			*ppNext = reinterpret_cast<VkBaseInStructure *>(flags2);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
		{
			auto *ci = static_cast<const VkRenderPassCreationControlEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
		{
			auto *ci = static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			auto *ci = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
		{
			auto *ci = static_cast<const VkSampleLocationsInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = new_pnext.pNext;
	return true;
}